

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::SourceSnippet::printTo(SourceSnippet *this,FormatBuffer *out,terminal_color highlightColor)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  bool bVar1;
  terminal_color in_DL;
  color_type in_RSI;
  long in_RDI;
  type_conflict1 *count;
  type_conflict1 *start;
  iterator __end3;
  iterator __begin3;
  SmallVector<std::pair<unsigned_long,_unsigned_long>,_4UL> *__range3;
  string_view view;
  size_t index;
  emphasis in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  color_type foreground;
  text_style *in_stack_fffffffffffffeb8;
  color_type in_stack_fffffffffffffec0;
  color_type in_stack_fffffffffffffec8;
  color_type in_stack_fffffffffffffed0;
  color_type local_fc [5];
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  type_conflict1 *local_88;
  type_conflict1 *local_80;
  unsigned_long local_78;
  unsigned_long local_70;
  iterator local_68;
  iterator local_60;
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *local_58;
  __sv_type local_50;
  long local_40;
  __sv_type local_38;
  terminal_color local_11;
  color_type local_10;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,
             (char *)in_stack_fffffffffffffeb8);
  str._M_str = (char *)in_stack_fffffffffffffed0;
  str._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
  str._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
  str._M_len._4_4_ = in_stack_fffffffffffffec8.value;
  FormatBuffer::append((FormatBuffer *)in_stack_fffffffffffffec0,str);
  bVar1 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::empty
                    ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)(in_RDI + 0x40));
  if (bVar1) {
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb0);
    str_00._M_str = (char *)in_stack_fffffffffffffed0;
    str_00._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
    str_00._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
    str_00._M_len._4_4_ = in_stack_fffffffffffffec8.value;
    FormatBuffer::append((FormatBuffer *)in_stack_fffffffffffffec0,str_00);
  }
  else {
    local_40 = 0;
    local_50 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb0);
    local_58 = (SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)(in_RDI + 0x40);
    local_60 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::begin(local_58);
    local_68 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end(local_58);
    for (; local_60 != local_68; local_60 = local_60 + 1) {
      local_78 = local_60->first;
      local_70 = local_60->second;
      local_80 = std::get<0ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)0x566aa6);
      local_88 = std::get<1ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)0x566abb);
      in_stack_fffffffffffffec8 = local_10;
      local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffed0,(size_type)local_10,
                            (size_type)in_stack_fffffffffffffec0);
      str_01._M_str = (char *)in_stack_fffffffffffffed0;
      str_01._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
      str_01._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
      str_01._M_len._4_4_ = in_stack_fffffffffffffec8.value;
      FormatBuffer::append((FormatBuffer *)in_stack_fffffffffffffec0,str_01);
      in_stack_fffffffffffffed0 = local_10;
      ::fmt::v11::text_style::text_style
                ((text_style *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
      local_c0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8,
                            (size_type)in_stack_fffffffffffffec0);
      str_02._M_str = (char *)in_stack_fffffffffffffed0;
      str_02._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
      str_02._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
      str_02._M_len._4_4_ = in_stack_fffffffffffffec8.value;
      FormatBuffer::append
                ((FormatBuffer *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,str_02);
      local_40 = *local_80 + *local_88;
    }
    in_stack_fffffffffffffec0 = local_10;
    local_d0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8,
                          (size_type)local_10);
    str_03._M_str = (char *)in_stack_fffffffffffffed0;
    str_03._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
    str_03._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
    str_03._M_len._4_4_ = in_stack_fffffffffffffec8.value;
    FormatBuffer::append((FormatBuffer *)in_stack_fffffffffffffec0,str_03);
  }
  foreground = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,
             (char *)in_stack_fffffffffffffeb8);
  str_04._M_str = (char *)in_stack_fffffffffffffed0;
  str_04._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
  str_04._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
  str_04._M_len._4_4_ = in_stack_fffffffffffffec8.value;
  FormatBuffer::append((FormatBuffer *)in_stack_fffffffffffffec0,str_04);
  ::fmt::v11::detail::color_type::color_type(local_fc,local_11);
  ::fmt::v11::fg(foreground);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)foreground);
  str_05._M_str = (char *)in_stack_fffffffffffffed0;
  str_05._M_len._0_1_ = in_stack_fffffffffffffec8.is_rgb;
  str_05._M_len._1_3_ = in_stack_fffffffffffffec8._1_3_;
  str_05._M_len._4_4_ = in_stack_fffffffffffffec8.value;
  FormatBuffer::append((FormatBuffer *)in_stack_fffffffffffffec0,(text_style *)local_10,str_05);
  return;
}

Assistant:

void printTo(FormatBuffer& out, fmt::terminal_color highlightColor) {
        out.append("\n");

        if (invalidRanges.empty()) {
            out.append(snippetLine);
        }
        else {
            size_t index = 0;
            std::string_view view = snippetLine;
            for (auto [start, count] : invalidRanges) {
                SLANG_ASSERT(start >= index);
                out.append(view.substr(index, start - index));

                out.append(fmt::emphasis::reverse, view.substr(start, count));
                index = start + count;
            }

            out.append(view.substr(index));
        }

        out.append("\n");
        out.append(fg(highlightColor), highlightLine);
    }